

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O3

word Extra_Truth6MinimumRoundMany1(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  word wVar2;
  int iVar3;
  long lVar4;
  char pCanonPerm1 [16];
  ulong local_60;
  uint local_54;
  word local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_54 = *pCanonPhase;
  switch(local_54 >> 7) {
  case 0:
    do {
      local_60 = t;
      iVar3 = *pStore;
      lVar4 = 0;
      t = local_60;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          t = Extra_Truth6MinimumRoundOne_noEBFC(t,(int)lVar4,pCanonPerm,pCanonPhase);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_60 != t);
    break;
  case 1:
    do {
      local_60 = t;
      iVar3 = *pStore;
      lVar4 = 0;
      t = local_60;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          t = Extra_Truth6MinimumRoundOne(t,(int)lVar4,pCanonPerm,pCanonPhase);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_60 != t);
    break;
  case 2:
    local_54 = local_54 ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    wVar2 = t;
    do {
      local_60 = wVar2;
      iVar3 = *pStore;
      lVar4 = 0;
      wVar2 = local_60;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne_noEBFC(wVar2,(int)lVar4,pCanonPerm,pCanonPhase);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_60 != wVar2);
    wVar2 = ~t;
    do {
      iVar3 = *pStore;
      lVar4 = 0;
      local_50 = wVar2;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne_noEBFC(wVar2,(int)lVar4,(char *)&local_48,&local_54);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_50 != wVar2);
    goto LAB_0056b234;
  case 3:
    local_54 = local_54 ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    wVar2 = t;
    do {
      local_60 = wVar2;
      iVar3 = *pStore;
      lVar4 = 0;
      wVar2 = local_60;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne(wVar2,(int)lVar4,pCanonPerm,pCanonPhase);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_60 != wVar2);
    wVar2 = ~t;
    do {
      iVar3 = *pStore;
      lVar4 = 0;
      local_50 = wVar2;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          wVar2 = Extra_Truth6MinimumRoundOne(wVar2,(int)lVar4,(char *)&local_48,&local_54);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_50 != wVar2);
LAB_0056b234:
    if (local_50 < local_60) {
      *pCanonPhase = local_54;
      *(undefined8 *)pCanonPerm = local_48;
      *(undefined8 *)(pCanonPerm + 8) = uStack_40;
      local_60 = local_50;
    }
    break;
  default:
    do {
      local_60 = t;
      iVar3 = *pStore;
      lVar4 = 0;
      t = local_60;
      do {
        iVar1 = pStore[lVar4 + 1];
        if (iVar3 == pStore[lVar4 + 1]) {
          t = Extra_Truth6MinimumRoundOne(t,(int)lVar4,pCanonPerm,pCanonPhase);
          iVar1 = iVar3;
        }
        iVar3 = iVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
    } while (local_60 != t);
  }
  return local_60;
}

Assistant:

word Extra_Truth6MinimumRoundMany1( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tMin0, tMin=t;
    char pCanonPerm1[16];
    unsigned uCanonPhase1;
    switch ((* pCanonPhase) >> 7)
    {
    case 0 :
        {

    	    return Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 1 :
        {            
            return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 2 :
        { 
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany_noEBFC( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    case 3 :
        {
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    }
    return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
}